

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::choldc(double **a,int n,double **l)

{
  double *pdVar1;
  void *__s;
  double **ppdVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  size_t __n;
  ulong uVar8;
  double **ppdVar9;
  double dVar10;
  
  __n = (long)(int)(n + 1U) << 3;
  uVar4 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar4 = __n;
  }
  __s = operator_new__(uVar4);
  memset(__s,0,__n);
  if (0 < n) {
    uVar8 = (ulong)(n + 1U);
    uVar5 = 1;
    lVar7 = 2;
    uVar4 = uVar5;
    do {
      do {
        dVar10 = a[uVar4][uVar5];
        if (1 < uVar4) {
          lVar3 = lVar7;
          do {
            uVar6 = (int)lVar3 - 2;
            dVar10 = dVar10 - a[uVar4][uVar6] * a[uVar5][uVar6];
            lVar3 = lVar3 + -1;
          } while (2 < lVar3);
        }
        if (uVar4 == uVar5) {
          if (0.0 < dVar10) {
            if (dVar10 < 0.0) {
              dVar10 = sqrt(dVar10);
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            *(double *)((long)__s + uVar4 * 8) = dVar10;
          }
        }
        else {
          a[uVar5][uVar4] = dVar10 / *(double *)((long)__s + uVar4 * 8);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar8);
      uVar5 = uVar4 + 1;
      lVar7 = lVar7 + 1;
      uVar4 = uVar5;
    } while (uVar5 != uVar8);
    if (0 < n) {
      ppdVar9 = a + 1;
      uVar4 = 1;
      ppdVar2 = l;
      do {
        ppdVar2 = ppdVar2 + 1;
        pdVar1 = l[uVar4];
        lVar7 = 0;
        do {
          if (lVar7 == 0) {
            dVar10 = *(double *)((long)__s + uVar4 * 8);
            uVar5 = uVar4;
          }
          else {
            ppdVar2[lVar7][uVar4] = ppdVar9[lVar7][uVar4];
            dVar10 = 0.0;
            uVar5 = uVar4 + lVar7;
          }
          pdVar1[uVar5] = dVar10;
          lVar7 = lVar7 + 1;
        } while ((uVar4 - uVar8) + lVar7 != 0);
        uVar4 = uVar4 + 1;
        ppdVar9 = ppdVar9 + 1;
      } while (uVar4 != uVar8);
    }
  }
  operator_delete__(__s);
  return;
}

Assistant:

void EDCircles::choldc(double ** a, int n, double ** l)
{
	int i, j, k;
	double sum;
	double *p = new double[n + 1];
	memset(p, 0, sizeof(double)*(n + 1));


	for (i = 1; i <= n; i++)
	{
		for (j = i; j <= n; j++)
		{
			for (sum = a[i][j], k = i - 1; k >= 1; k--) sum -= a[i][k] * a[j][k];
			if (i == j)
			{
				if (sum <= 0.0)
					// printf("\nA is not poitive definite!");
				{
				}
				else
					p[i] = sqrt(sum);
			}
			else
			{
				a[j][i] = sum / p[i];
			}
		}
	}
	for (i = 1; i <= n; i++) {
		for (j = i; j <= n; j++) {
			if (i == j)
				l[i][i] = p[i];
			else
			{
				l[j][i] = a[j][i];
				l[i][j] = 0.0;
			}
		} //end-for-inner
	} // end-for-outer

	delete[] p;
}